

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

int __thiscall ncnn::Padding::load_model(Padding *this,ModelBin *mb)

{
  Mat local_50;
  
  if (this->per_channel_pad_data_size != 0) {
    (*mb->_vptr_ModelBin[2])(&local_50,mb,(ulong)(uint)this->per_channel_pad_data_size,1);
    Mat::operator=(&this->per_channel_pad_data,&local_50);
    Mat::~Mat(&local_50);
  }
  return 0;
}

Assistant:

int Padding::load_model(const ModelBin& mb)
{
    if (per_channel_pad_data_size)
    {
        per_channel_pad_data = mb.load(per_channel_pad_data_size, 1);
    }

    return 0;
}